

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void * sqlite3HashInsert(Hash *pH,char *pKey,void *data)

{
  Hash *pHVar1;
  int iVar2;
  uint uVar3;
  HashElem *pHVar4;
  _ht *local_58;
  void *old_data;
  HashElem *new_elem;
  HashElem *elem;
  Hash *pHStack_28;
  uint h;
  void *data_local;
  char *pKey_local;
  Hash *pH_local;
  
  pHStack_28 = (Hash *)data;
  data_local = pKey;
  pKey_local = (char *)pH;
  pHVar4 = findElementWithHash(pH,pKey,(uint *)((long)&elem + 4));
  if (pHVar4->data == (void *)0x0) {
    if (pHStack_28 == (Hash *)0x0) {
      pH_local = (Hash *)0x0;
    }
    else {
      pHVar4 = (HashElem *)sqlite3Malloc(0x20);
      if (pHVar4 == (HashElem *)0x0) {
        pH_local = pHStack_28;
      }
      else {
        pHVar4->pKey = (char *)data_local;
        pHVar4->data = pHStack_28;
        *(int *)(pKey_local + 4) = *(int *)(pKey_local + 4) + 1;
        if (((9 < *(uint *)(pKey_local + 4)) &&
            ((uint)(*(int *)pKey_local * 2) < *(uint *)(pKey_local + 4))) &&
           (iVar2 = rehash((Hash *)pKey_local,*(int *)(pKey_local + 4) << 1), iVar2 != 0)) {
          uVar3 = strHash((char *)data_local);
          elem._4_4_ = uVar3 % *(uint *)pKey_local;
        }
        if (*(long *)(pKey_local + 0x10) == 0) {
          local_58 = (_ht *)0x0;
        }
        else {
          local_58 = (_ht *)(*(long *)(pKey_local + 0x10) + (ulong)elem._4_4_ * 0x10);
        }
        insertElement((Hash *)pKey_local,local_58,pHVar4);
        pH_local = (Hash *)0x0;
      }
    }
  }
  else {
    pHVar1 = (Hash *)pHVar4->data;
    pH_local = pHVar1;
    if (pHStack_28 == (Hash *)0x0) {
      removeElementGivenHash((Hash *)pKey_local,pHVar4,elem._4_4_);
    }
    else {
      pHVar4->data = pHStack_28;
      pHVar4->pKey = (char *)data_local;
    }
  }
  return pH_local;
}

Assistant:

SQLITE_PRIVATE void *sqlite3HashInsert(Hash *pH, const char *pKey, void *data){
  unsigned int h;       /* the hash of the key modulo hash table size */
  HashElem *elem;       /* Used to loop thru the element list */
  HashElem *new_elem;   /* New element added to the pH */

  assert( pH!=0 );
  assert( pKey!=0 );
  elem = findElementWithHash(pH,pKey,&h);
  if( elem->data ){
    void *old_data = elem->data;
    if( data==0 ){
      removeElementGivenHash(pH,elem,h);
    }else{
      elem->data = data;
      elem->pKey = pKey;
    }
    return old_data;
  }
  if( data==0 ) return 0;
  new_elem = (HashElem*)sqlite3Malloc( sizeof(HashElem) );
  if( new_elem==0 ) return data;
  new_elem->pKey = pKey;
  new_elem->data = data;
  pH->count++;
  if( pH->count>=10 && pH->count > 2*pH->htsize ){
    if( rehash(pH, pH->count*2) ){
      assert( pH->htsize>0 );
      h = strHash(pKey) % pH->htsize;
    }
  }
  insertElement(pH, pH->ht ? &pH->ht[h] : 0, new_elem);
  return 0;
}